

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorder.hpp
# Opt level: O1

void MGARD::switch_rows_2D_by_buffer<float>
               (float *data_pos,float *data_buffer,size_t n1,size_t n2,size_t stride)

{
  long lVar1;
  float *pfVar2;
  long lVar3;
  float *__dest;
  
  lVar1 = (n1 >> 1) + 1;
  lVar3 = lVar1 * n2;
  __dest = data_pos + stride;
  lVar1 = n1 - lVar1;
  pfVar2 = __dest;
  if (lVar1 != 0) {
    lVar1 = lVar1 + (ulong)(lVar1 == 0);
    pfVar2 = data_buffer;
    do {
      memcpy(pfVar2 + lVar3,data_pos + stride,n2 * 4);
      data_pos = data_pos + stride * 2;
      pfVar2 = pfVar2 + n2;
      memcpy(pfVar2,data_pos,n2 * 4);
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
    pfVar2 = data_pos + stride;
  }
  if ((n1 & 1) == 0) {
    memcpy(data_buffer + (lVar3 - n2),pfVar2,n2 * 4);
  }
  if (1 < n1) {
    pfVar2 = data_buffer + n2;
    lVar1 = n1 - 1;
    do {
      memcpy(__dest,pfVar2,n2 * 4);
      pfVar2 = pfVar2 + n2;
      __dest = __dest + stride;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void switch_rows_2D_by_buffer(T * data_pos, T * data_buffer, size_t n1, size_t n2, size_t stride){
    size_t n1_nodal = (n1 >> 1) + 1;
    size_t n1_coeff = n1 - n1_nodal;
    T * nodal_data_buffer = data_buffer + n2; // skip the first nodal row
    T * coeff_data_buffer = data_buffer + n1_nodal * n2;
    T * cur_data_pos = data_pos + stride;
    for(int i=0; i<n1_coeff; i++){
        // copy coefficient rows
        memcpy(coeff_data_buffer + i * n2, cur_data_pos, n2 * sizeof(T));
        cur_data_pos += stride;
        // copy nodal rows
        memcpy(nodal_data_buffer + i * n2, cur_data_pos, n2 * sizeof(T));
        cur_data_pos += stride;
    }
    if(!(n1&1)){
        // n1 is even, move the last nodal row
        memcpy(coeff_data_buffer - n2, cur_data_pos, n2 * sizeof(T));
    }
    // copy data back
    cur_data_pos = data_pos + stride;
    for(int i=1; i<n1; i++){
        memcpy(cur_data_pos, data_buffer + i * n2, n2 * sizeof(T));
        cur_data_pos += stride;
    }
}